

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool __thiscall libcellml::Model::isDefined(Model *this)

{
  ulong uVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *this_00;
  size_t sVar4;
  element_type *this_01;
  byte local_81;
  byte local_61;
  shared_ptr<libcellml::Component> local_58;
  ulong local_48;
  size_t index_1;
  element_type *local_20;
  size_t index;
  Model *pMStack_10;
  bool defined;
  Model *this_local;
  
  index._7_1_ = 1;
  local_20 = (element_type *)0x0;
  pMStack_10 = this;
  while( true ) {
    peVar2 = local_20;
    peVar3 = (element_type *)unitsCount(this);
    local_61 = 0;
    if (peVar2 < peVar3) {
      local_61 = index._7_1_;
    }
    if ((local_61 & 1) == 0) break;
    units((Model *)&stack0xffffffffffffffd0,(size_t)this);
    this_00 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&stack0xffffffffffffffd0);
    index._7_1_ = Units::isDefined(this_00);
    std::shared_ptr<libcellml::Units>::~shared_ptr
              ((shared_ptr<libcellml::Units> *)&stack0xffffffffffffffd0);
    local_20 = (element_type *)
               ((long)&(local_20->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.
                       super_Entity._vptr_Entity + 1);
  }
  local_48 = 0;
  while( true ) {
    uVar1 = local_48;
    sVar4 = ComponentEntity::componentCount(&this->super_ComponentEntity);
    local_81 = 0;
    if (uVar1 < sVar4) {
      local_81 = index._7_1_;
    }
    if ((local_81 & 1) == 0) break;
    ComponentEntity::component((ComponentEntity *)&local_58,(size_t)this);
    this_01 = std::
              __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&local_58);
    index._7_1_ = Component::isDefined(this_01);
    std::shared_ptr<libcellml::Component>::~shared_ptr(&local_58);
    local_48 = local_48 + 1;
  }
  return (bool)(index._7_1_ & 1);
}

Assistant:

bool Model::isDefined() const
{
    bool defined = true;
    for (size_t index = 0; (index < unitsCount()) && defined; ++index) {
        defined = units(index)->isDefined();
    }
    for (size_t index = 0; (index < componentCount()) && defined; ++index) {
        defined = component(index)->isDefined();
    }
    return defined;
}